

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

TypeAssignmentSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  TypeAssignmentSyntax *pTVar1;
  size_t index_local;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *this_local;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index << 1);
  this_01 = TokenOrSyntax::node(this_00);
  pTVar1 = SyntaxNode::as<slang::syntax::TypeAssignmentSyntax>(this_01);
  return pTVar1;
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }